

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmSourceFile * __thiscall
cmMakefile::CreateSource
          (cmMakefile *this,string *sourceName,bool generated,cmSourceFileLocationKind kind)

{
  cmake *this_00;
  pointer pcVar1;
  cmSourceFileLocation *this_01;
  string *file;
  mapped_type *this_02;
  mapped_type *ppcVar2;
  reference this_03;
  pointer local_68 [3];
  undefined1 local_50 [8];
  string name;
  __single_object sf;
  cmSourceFileLocationKind kind_local;
  bool generated_local;
  string *sourceName_local;
  cmMakefile *this_local;
  
  name.field_2._8_8_ = this;
  sf._M_t.super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>._M_t.
  super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>.
  super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl._0_4_ = kind;
  sf._M_t.super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>._M_t.
  super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>.
  super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl._7_1_ = generated;
  std::
  make_unique<cmSourceFile,cmMakefile*,std::__cxx11::string_const&,bool&,cmSourceFileLocationKind&>
            ((cmMakefile **)&stack0xffffffffffffffd8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&name.field_2 + 8),(bool *)sourceName,
             (cmSourceFileLocationKind *)
             ((long)&sf._M_t.super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>.
                     super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl + 7));
  this_00 = GetCMakeInstance(this);
  pcVar1 = std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>::operator->
                     ((unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_> *)
                      &stack0xffffffffffffffd8);
  this_01 = cmSourceFile::GetLocation(pcVar1);
  file = cmSourceFileLocation::GetName_abi_cxx11_(this_01);
  cmake::StripExtension((string *)local_50,this_00,file);
  this_02 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
            ::operator[](&this->SourceFileSearchIndex,(key_type *)local_50);
  local_68[0] = std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>::get
                          ((unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_> *)
                           &stack0xffffffffffffffd8);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back(this_02,local_68);
  if ((cmSourceFileLocationKind)
      sf._M_t.super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>._M_t.
      super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>.
      super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl == Known) {
    pcVar1 = std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>::get
                       ((unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_> *)
                        &stack0xffffffffffffffd8);
    ppcVar2 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
              ::operator[](&this->KnownFileSearchIndex,sourceName);
    *ppcVar2 = pcVar1;
  }
  std::
  vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
  ::push_back(&this->SourceFiles,(value_type *)&stack0xffffffffffffffd8);
  this_03 = std::
            vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
            ::back(&this->SourceFiles);
  pcVar1 = std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>::get(this_03);
  std::__cxx11::string::~string((string *)local_50);
  std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>::~unique_ptr
            ((unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_> *)
             &stack0xffffffffffffffd8);
  return pcVar1;
}

Assistant:

cmSourceFile* cmMakefile::CreateSource(const std::string& sourceName,
                                       bool generated,
                                       cmSourceFileLocationKind kind)
{
  auto sf = cm::make_unique<cmSourceFile>(this, sourceName, generated, kind);
  auto name =
    this->GetCMakeInstance()->StripExtension(sf->GetLocation().GetName());
#if defined(_WIN32) || defined(__APPLE__)
  name = cmSystemTools::LowerCase(name);
#endif
  this->SourceFileSearchIndex[name].push_back(sf.get());
  // for "Known" paths add direct lookup (used for faster lookup in GetSource)
  if (kind == cmSourceFileLocationKind::Known) {
    this->KnownFileSearchIndex[sourceName] = sf.get();
  }

  this->SourceFiles.push_back(std::move(sf));

  return this->SourceFiles.back().get();
}